

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O0

bool __thiscall
uWS::WebSocketProtocol<false>::consumeContinuation
          (WebSocketProtocol<false> *this,char **src,uint *length,void *user)

{
  bool bVar1;
  uint *in_RDX;
  long *in_RSI;
  undefined1 *in_RDI;
  bool in_stack_000000af;
  int in_stack_000000b0;
  uint in_stack_000000b4;
  size_t in_stack_000000b8;
  char *in_stack_000000c0;
  WebSocketProtocol<false> *in_stack_000000c8;
  void *in_stack_000000e0;
  bool local_1;
  
  if (*in_RDX < *(uint *)(in_RDI + 0x10)) {
    *(uint *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) - *in_RDX;
    bVar1 = handleFragment(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,
                           in_stack_000000b0,in_stack_000000af,in_stack_000000e0);
    if (bVar1) {
      local_1 = false;
    }
    else {
      local_1 = false;
    }
  }
  else {
    bVar1 = handleFragment(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,
                           in_stack_000000b0,in_stack_000000af,in_stack_000000e0);
    if (bVar1) {
      local_1 = false;
    }
    else {
      if (in_RDI[3] != '\0') {
        in_RDI[2] = in_RDI[2] + -1;
      }
      *in_RSI = *in_RSI + (ulong)*(uint *)(in_RDI + 0x10);
      *in_RDX = *in_RDX - *(int *)(in_RDI + 0x10);
      *in_RDI = 0;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

inline bool consumeContinuation(char *&src, unsigned int &length, void *user) {
        if (remainingBytes <= length) {
            if (isServer) {
                int n = remainingBytes >> 2;
                unmaskInplace(src, src + n * 4, mask);
                for (int i = 0, s = remainingBytes % 4; i < s; i++) {
                    src[n * 4 + i] ^= mask[i];
                }
            }

            if (handleFragment(src, remainingBytes, 0, opCode[(unsigned char) opStack], lastFin, user)) {
                return false;
            }

            if (lastFin) {
                opStack--;
            }

            src += remainingBytes;
            length -= remainingBytes;
            state = READ_HEAD;
            return true;
        } else {
            if (isServer) {
                unmaskInplace(src, src + ((length >> 2) + 1) * 4, mask);
            }

            remainingBytes -= length;
            if (handleFragment(src, length, remainingBytes, opCode[(unsigned char) opStack], lastFin, user)) {
                return false;
            }

            if (isServer && length % 4) {
                rotateMask(4 - (length % 4), mask);
            }
            return false;
        }
    }